

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O1

void CVmObjList::join(vm_val_t *retval,vm_val_t *self_val,char *sep,size_t sep_len)

{
  CVmObjPageEntry *this;
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  vm_val_t *pvVar4;
  vm_obj_id_t vVar5;
  vm_obj_id_t vVar6;
  int iVar7;
  ushort *puVar8;
  size_t len;
  char *pcVar9;
  long lVar10;
  vm_val_t *pvVar11;
  long lVar12;
  bool bVar13;
  vm_val_t ele;
  vm_val_t tmp_str;
  char buf [128];
  vm_val_t local_e8;
  char *local_d8;
  ulong local_d0;
  vm_val_t local_c8;
  vm_val_t local_b8 [8];
  
  pvVar11 = sp_;
  uVar2 = *(undefined4 *)&self_val->field_0x4;
  aVar1 = self_val->val;
  sp_ = sp_ + 1;
  pvVar11->typ = self_val->typ;
  *(undefined4 *)&pvVar11->field_0x4 = uVar2;
  pvVar11->val = aVar1;
  local_d8 = sep;
  vVar5 = vm_val_t::ll_length(self_val);
  if ((int)vVar5 < 1) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    vVar6 = 1;
    do {
      local_b8[0].typ = VM_INT;
      local_b8[0].val._0_4_ = vVar6;
      vm_val_t::ll_index(self_val,&local_e8,local_b8);
      puVar8 = (ushort *)vm_val_t::get_as_string(&local_e8);
      if (puVar8 == (ushort *)0x0) {
        if (local_e8.typ == VM_OBJ) {
          lVar12 = lVar12 + 0x80;
        }
        else if (local_e8.typ == VM_INT) {
          lVar12 = lVar12 + 10;
        }
      }
      else {
        lVar12 = lVar12 + (ulong)*puVar8;
      }
      bVar13 = vVar6 != vVar5;
      vVar6 = vVar6 + 1;
    } while (bVar13);
  }
  lVar10 = (vVar5 - 1) * sep_len;
  if ((int)vVar5 < 1) {
    lVar10 = 0;
  }
  vVar6 = CVmObjString::create(0,lVar10 + lVar12);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar6;
  pvVar11 = sp_;
  this = G_obj_table_X.pages_[vVar6 >> 0xc] + (vVar6 & 0xfff);
  pcVar9 = *(char **)((long)&this->ptr_ + 8) + 2;
  uVar2 = *(undefined4 *)&retval->field_0x4;
  aVar1 = retval->val;
  sp_ = sp_ + 1;
  pvVar11->typ = retval->typ;
  *(undefined4 *)&pvVar11->field_0x4 = uVar2;
  pvVar11->val = aVar1;
  if (0 < (int)vVar5) {
    local_d0 = (ulong)-vVar5;
    vVar6 = 1;
    do {
      local_b8[0].typ = VM_INT;
      local_b8[0].val._0_4_ = vVar6;
      vm_val_t::ll_index(self_val,&local_e8,local_b8);
      local_c8.typ = VM_NIL;
      puVar8 = (ushort *)vm_val_t::get_as_string(&local_e8);
      if (puVar8 == (ushort *)0x0) {
        if (local_e8.typ == VM_NIL) {
          pvVar11 = (vm_val_t *)0x2bee85;
          len = 0;
        }
        else {
          if (local_e8.typ != VM_INT) {
            puVar8 = (ushort *)vm_val_t::cast_to_string(&local_e8,&local_c8);
            if (puVar8 == (ushort *)0x0) {
              err_throw(0x900);
            }
            goto LAB_00275597;
          }
          pvVar11 = local_b8;
          sprintf((char *)pvVar11,"%ld",(long)local_e8.val.intval);
          len = strlen((char *)pvVar11);
        }
      }
      else {
LAB_00275597:
        len = (size_t)*puVar8;
        pvVar11 = (vm_val_t *)(puVar8 + 1);
      }
      pvVar3 = sp_;
      pvVar4 = sp_ + 1;
      *(ulong *)sp_ = CONCAT44(local_c8._4_4_,local_c8.typ);
      sp_ = pvVar4;
      pvVar3->val = local_c8.val;
      pcVar9 = CVmObjString::cons_ensure_space((CVmObjString *)this,pcVar9,len,0x100);
      memcpy(pcVar9,pvVar11,len);
      pcVar9 = pcVar9 + len;
      if ((int)vVar6 < (int)vVar5 && sep_len != 0) {
        pcVar9 = CVmObjString::cons_ensure_space((CVmObjString *)this,pcVar9,sep_len,0x20);
        memcpy(pcVar9,local_d8,sep_len);
        pcVar9 = pcVar9 + sep_len;
      }
      sp_ = sp_ + -1;
      iVar7 = (int)local_d0 + vVar6;
      vVar6 = vVar6 + 1;
    } while (iVar7 != 0);
  }
  CVmObjString::cons_shrink_buffer((CVmObjString *)this,pcVar9);
  sp_ = sp_ + -2;
  return;
}

Assistant:

void CVmObjList::join(VMG_ vm_val_t *retval,
                      const vm_val_t *self_val,
                      const char *sep, size_t sep_len)
{
    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* 
     *   Do a first pass through the list to measure the size we'll need.
     *   For string elements we'll know exactly what we need; for
     *   non-strings, make a guess, and we'll expand the buffer later if
     *   needed.  
     */
    vm_val_t ele;
    size_t alo_len = 0;
    int i, lst_len = self_val->ll_length(vmg0_);
    for (i = 1 ; i <= lst_len ; ++i)
    {
        /* get this element */
        self_val->ll_index(vmg_ &ele, i);

        /* if it's a string, get its length; for other types, make a guess */
        const char *es = ele.get_as_string(vmg0_);
        if (es != 0)
        {
            /* it's a string - add its length to the running total */
            alo_len += vmb_get_len(es);
        }
        else
        {
            /* for other types, guess based on the type */
            switch (ele.typ)
            {
            case VM_INT:
                /* integers - leave room for 10 characters */
                alo_len += 10;
                break;

            case VM_OBJ:
                /* 
                 *   object conversion could take almost any amount of space;
                 *   make a wild guess for now 
                 */
                alo_len += 128;
                break;

            default:
                /* assume nothing for other types */
                break;
            }
        }
    }

    /* add in the space needed for the separators */
    if (lst_len > 0)
        alo_len += sep_len * (lst_len - 1);

    /* create a string with the allocated size */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, alo_len));
    CVmObjString *strp = (CVmObjString *)vm_objp(vmg_ retval->val.obj);

    /* get a write pointer to the buffer */
    char *dst = strp->cons_get_buf();

    /* push it for gc protection */
    G_stk->push(retval);

    /* build the string */
    for (i = 1 ; i <= lst_len ; ++i)
    {
        char buf[128];
        vm_val_t tmp_str;

        /* get this element */
        self_val->ll_index(vmg_ &ele, i);

        /* assume we won't need a temporary string */
        tmp_str.set_nil();

        /* try getting it as a string directly */
        const char *es = ele.get_as_string(vmg0_);
        size_t es_len;
        if (es != 0)
        {
            /* it's a string - get its length and buffer */
            es_len = vmb_get_len(es);
            es += VMB_LEN;
        }
        else
        {
            /* for other types, do the implied string conversion */
            switch (ele.typ)
            {
            case VM_INT:
                /* integer - format in decimal */
                sprintf(buf, "%ld", (long)ele.val.intval);
                es = buf;
                es_len = strlen(es);
                break;

            case VM_NIL:
                /* nil - use an empty string */
                es = "";
                es_len = 0;
                break;

            default:
                /* for anything else, see what casting comes up with */
                if ((es = ele.cast_to_string(vmg_ &tmp_str)) == 0)
                    err_throw(VMERR_BAD_TYPE_BIF);

                /* get the length and buffer */
                es_len = vmb_get_len(es);
                es += VMB_LEN;
                break;
            }
        }

        /* push the temp string (if any) for gc protection */
        G_stk->push(&tmp_str);

        /* append the current string, making sure we have enough space */
        dst = strp->cons_ensure_space(vmg_ dst, es_len, 256);
        memcpy(dst, es, es_len);
        dst += es_len;

        /* if there's another element, append the separator */
        if (i < lst_len && sep_len != 0)
        {
            dst = strp->cons_ensure_space(vmg_ dst, sep_len, 32);
            memcpy(dst, sep, sep_len);
            dst += sep_len;
        }

        /* discard the temp string */
        G_stk->discard(1);
    }

    /* set the string to its final length */
    strp->cons_shrink_buffer(vmg_ dst);

    /* remove gc protection */
    G_stk->discard(2);
}